

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderReturnTests.cpp
# Opt level: O3

int __thiscall
vkt::sr::anon_unknown_0::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  TestNode *pTVar5;
  long *plVar6;
  void *pvVar7;
  mapped_type *pmVar8;
  ShaderEvalFunc p_Var9;
  _Base_ptr *extraout_RAX;
  undefined8 uVar10;
  UniformSetup *pUVar11;
  _Base_ptr *extraout_RAX_00;
  _Base_ptr *pp_Var12;
  long *plVar13;
  size_type *psVar14;
  char *pcVar15;
  char *pcVar16;
  byte bVar17;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar18;
  ulong uVar19;
  _Alloc_hider _Var20;
  char *pcVar21;
  bool bVar22;
  bool bVar23;
  key_type local_198;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  StringTemplate tmpl;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  string description;
  string name;
  key_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char *local_60;
  TestContext *local_58;
  char *__end;
  char *local_48;
  char *local_40;
  uint local_34;
  
  pTVar5 = (TestNode *)operator_new(0xe0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&params,"single_return_vertex","");
  tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tmpl,"Single return statement in function","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,"");
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,true,&local_198,
             evalReturnAlways,(UniformSetup *)0x0);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT17(local_198.field_2._M_local_buf[7],
                             CONCAT16(local_198.field_2._M_local_buf[6],
                                      CONCAT15(local_198.field_2._M_local_buf[5],
                                               CONCAT14(local_198.field_2._M_local_buf[4],
                                                        local_198.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
    operator_delete(tmpl.m_template._M_dataplus._M_p,
                    tmpl.m_template.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
      &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)params._M_t._M_impl._0_8_,
                    (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  pTVar5 = (TestNode *)operator_new(0xe0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&params,"single_return_fragment","");
  tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tmpl,"Single return statement in function","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,
             "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,"");
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,false,&local_198,
             evalReturnAlways,(UniformSetup *)0x0);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT17(local_198.field_2._M_local_buf[7],
                             CONCAT16(local_198.field_2._M_local_buf[6],
                                      CONCAT15(local_198.field_2._M_local_buf[5],
                                               CONCAT14(local_198.field_2._M_local_buf[4],
                                                        local_198.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
    operator_delete(tmpl.m_template._M_dataplus._M_p,
                    tmpl.m_template.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
      &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)params._M_t._M_impl._0_8_,
                    (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  uVar4 = 0;
  do {
    pcVar15 = (char *)(ulong)uVar4;
    bVar23 = true;
    local_60 = pcVar15;
    do {
      tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&tmpl,"conditional_return_","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&tmpl);
      params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      plVar13 = plVar6 + 2;
      if ((long *)*plVar6 == plVar13) {
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
      }
      else {
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
        params._M_t._M_impl._0_8_ = (long *)*plVar6;
      }
      params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
      *plVar6 = (long)plVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&params);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar14) {
        name.field_2._M_allocated_capacity = *psVar14;
        name.field_2._8_8_ = plVar6[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar14;
        name._M_dataplus._M_p = (pointer)*plVar6;
      }
      name._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
        operator_delete(tmpl.m_template._M_dataplus._M_p,
                        tmpl.m_template.field_2._M_allocated_capacity + 1);
      }
      if ((uint)pcVar15 < 3) {
        pcVar15 = (&PTR_anon_var_dwarf_c11c2d_00cf7858)[(long)pcVar15];
      }
      else {
        pcVar15 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar15,(allocator<char> *)&tmpl);
      plVar6 = (long *)std::__cxx11::string::append((char *)&params);
      description._M_dataplus._M_p = (pointer)&description.field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar14) {
        description.field_2._M_allocated_capacity = *psVar14;
        description.field_2._8_8_ = plVar6[3];
      }
      else {
        description.field_2._M_allocated_capacity = *psVar14;
        description._M_dataplus._M_p = (pointer)*plVar6;
      }
      description._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      local_58 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_198._M_dataplus._M_p = (pointer)0x129;
      pvVar7 = (void *)std::__cxx11::string::_M_create((ulong *)&params,(ulong)&local_198);
      _Var20._M_p = local_198._M_dataplus._M_p;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_198._M_dataplus._M_p;
      params._M_t._M_impl._0_8_ = pvVar7;
      memcpy(pvVar7,
             "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\n${EXTRADECL}\n${COORDPREC} vec4 getColor (void)\n{\n    if (${RETURNCOND})\n        return vec4(${COORDS}.xyz, 1.0);\n    return vec4(${COORDS}.wzy, 1.0);\n}\n\nvoid main (void)\n{\n${POSITIONWRITE}    ${OUTPUT} = getColor();\n}\n"
             ,0x129);
      params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = _Var20._M_p;
      *((long)pvVar7 + _Var20._M_p) = '\0';
      tcu::StringTemplate::StringTemplate(&tmpl,(string *)&params);
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      pcVar21 = "v_coords";
      if (bVar23 != false) {
        pcVar21 = "a_coords";
      }
      params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &params._M_t._M_impl.super__Rb_tree_header._M_header;
      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
      local_198.field_2._M_local_buf[4] = 'D';
      local_198.field_2._M_local_buf[5] = 'L';
      local_198.field_2._M_local_buf[6] = 'O';
      local_198.field_2._M_local_buf[7] = 'C';
      local_198._M_string_length = 8;
      local_198.field_2._M_local_buf[8] = '\0';
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_198);
      pcVar15 = "%type = OpTypeInt 32 0";
      if (bVar23 != false) {
        pcVar15 = "%type = OpTypeInt 32 1";
      }
      std::__cxx11::string::_M_replace
                ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)(pcVar15 + 0x15));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
      local_198.field_2._M_local_buf[4] = 'D';
      local_198.field_2._M_local_buf[5] = 'P';
      local_198.field_2._M_local_buf[6] = 'R';
      local_198.field_2._M_local_buf[7] = 'E';
      local_198.field_2._M_local_buf[8] = 'C';
      local_198._M_string_length = 9;
      local_198.field_2._M_local_buf[9] = '\0';
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_198);
      pcVar15 = "_mediump";
      if (bVar23 != false) {
        pcVar15 = "_highp";
      }
      std::__cxx11::string::_M_replace
                ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)(pcVar15 + 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198.field_2._M_local_buf[4] = 'U';
      local_198.field_2._M_local_buf[5] = 'T';
      local_198.field_2._M_allocated_capacity._0_4_ = 0x5054554f;
      local_198._M_string_length = 6;
      local_198.field_2._M_local_buf[6] = '\0';
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_198);
      pcVar15 = "o_color";
      if (bVar23 != false) {
        pcVar15 = "v_color";
      }
      std::__cxx11::string::_M_replace
                ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198.field_2._M_local_buf[4] = 'D';
      local_198.field_2._M_local_buf[5] = 'S';
      local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
      local_198._M_string_length = 6;
      local_198.field_2._M_local_buf[6] = '\0';
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_198);
      pcVar15 = local_60;
      std::__cxx11::string::_M_replace
                ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198.field_2._M_allocated_capacity._0_4_ = 0x52545845;
      local_198.field_2._M_local_buf[4] = 'A';
      local_198.field_2._M_local_buf[5] = 'D';
      local_198.field_2._M_local_buf[6] = 'E';
      local_198.field_2._M_local_buf[7] = 'C';
      local_198.field_2._M_local_buf[8] = 'L';
      local_198._M_string_length = 9;
      local_198.field_2._M_local_buf[9] = '\0';
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_198);
      pcVar16 = "layout(location = 0) out mediump vec4 o_color;\n";
      if (bVar23 != false) {
        pcVar16 = 
        "layout(location = 0) in highp vec4 a_position;\nlayout(location = 0) out mediump vec4 v_color;\n"
        ;
      }
      std::__cxx11::string::_M_replace
                ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198.field_2._M_local_buf[8] = 'W';
      local_198.field_2._M_local_buf[9] = 'R';
      local_198.field_2._M_local_buf[10] = 'I';
      local_198.field_2._11_2_ = 0x4554;
      local_198.field_2._M_allocated_capacity._0_4_ = 0x49534f50;
      local_198.field_2._M_local_buf[4] = 'T';
      local_198.field_2._M_local_buf[5] = 'I';
      local_198.field_2._M_local_buf[6] = 'O';
      local_198.field_2._M_local_buf[7] = 'N';
      local_198._M_string_length = 0xd;
      local_198.field_2._M_local_buf[0xd] = '\0';
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_198);
      pcVar16 = "";
      if (bVar23 != false) {
        pcVar16 = "    gl_Position = a_position;\n";
      }
      std::__cxx11::string::_M_replace
                ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      uVar4 = (uint)pcVar15;
      if (pcVar15 == (char *)0x0) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_198.field_2._M_allocated_capacity._0_4_ = 0x55544552;
        local_198.field_2._M_local_buf[4] = 'R';
        local_198.field_2._M_local_buf[5] = 'N';
        local_198.field_2._M_local_buf[6] = 'C';
        local_198.field_2._M_local_buf[7] = 'O';
        local_198.field_2._M_local_buf[8] = 'N';
        local_198.field_2._M_local_buf[9] = 'D';
        local_198._M_string_length = 10;
        local_198.field_2._M_local_buf[10] = '\0';
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_198);
        std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0xb6d80d);
LAB_005cd70f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          uVar10 = CONCAT17(local_198.field_2._M_local_buf[7],
                            CONCAT16(local_198.field_2._M_local_buf[6],
                                     CONCAT15(local_198.field_2._M_local_buf[5],
                                              CONCAT14(local_198.field_2._M_local_buf[4],
                                                       local_198.field_2._M_allocated_capacity._0_4_
                                                      ))));
          _Var20._M_p = local_198._M_dataplus._M_p;
LAB_005cd8ef:
          operator_delete(_Var20._M_p,uVar10 + 1);
        }
      }
      else {
        if (uVar4 == 1) {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198.field_2._M_allocated_capacity._0_4_ = 0x55544552;
          local_198.field_2._M_local_buf[4] = 'R';
          local_198.field_2._M_local_buf[5] = 'N';
          local_198.field_2._M_local_buf[6] = 'C';
          local_198.field_2._M_local_buf[7] = 'O';
          local_198.field_2._M_local_buf[8] = 'N';
          local_198.field_2._M_local_buf[9] = 'D';
          local_198._M_string_length = 10;
          local_198.field_2._M_local_buf[10] = '\0';
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&params,&local_198);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0xb6d600);
          goto LAB_005cd70f;
        }
        if (uVar4 == 2) {
          local_80[0] = &local_70;
          pcVar16 = "v_coords";
          if (bVar23 != false) {
            pcVar16 = "a_coords";
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_80,pcVar21,pcVar16 + 8);
          plVar6 = (long *)std::__cxx11::string::append((char *)local_80);
          local_100 = &local_f0;
          plVar13 = plVar6 + 2;
          if ((long *)*plVar6 == plVar13) {
            local_f0 = *plVar13;
            lStack_e8 = plVar6[3];
          }
          else {
            local_f0 = *plVar13;
            local_100 = (long *)*plVar6;
          }
          local_f8 = plVar6[1];
          *plVar6 = (long)plVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
          local_120 = &local_110;
          plVar13 = plVar6 + 2;
          if ((long *)*plVar6 == plVar13) {
            local_110 = *plVar13;
            lStack_108 = plVar6[3];
          }
          else {
            local_110 = *plVar13;
            local_120 = (long *)*plVar6;
          }
          local_118 = plVar6[1];
          *plVar6 = (long)plVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          plVar13 = plVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar13) {
            lVar2 = *plVar13;
            lVar3 = plVar6[3];
            local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
            local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
            local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
            local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
            local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
            local_198.field_2._M_local_buf[8] = (char)lVar3;
            local_198.field_2._M_local_buf[9] = (char)((ulong)lVar3 >> 8);
            local_198.field_2._M_local_buf[10] = (char)((ulong)lVar3 >> 0x10);
            local_198.field_2._11_2_ = (undefined2)((ulong)lVar3 >> 0x18);
            local_198.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
            local_198.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
          }
          else {
            lVar2 = *plVar13;
            local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
            local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
            local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
            local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
            local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
            local_198._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_198._M_string_length = plVar6[1];
          *plVar6 = (long)plVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_a0.field_2._M_allocated_capacity = 0x4f434e5255544552;
          local_a0.field_2._8_2_ = 0x444e;
          local_a0._M_string_length = 10;
          local_a0.field_2._M_local_buf[10] = '\0';
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&params,&local_a0);
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            CONCAT17(local_198.field_2._M_local_buf[7],
                                     CONCAT16(local_198.field_2._M_local_buf[6],
                                              CONCAT15(local_198.field_2._M_local_buf[5],
                                                       CONCAT14(local_198.field_2._M_local_buf[4],
                                                                local_198.field_2.
                                                                _M_allocated_capacity._0_4_)))) + 1)
            ;
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          if (local_100 != &local_f0) {
            operator_delete(local_100,local_f0 + 1);
          }
          uVar10 = local_70._M_allocated_capacity;
          _Var20._M_p = (pointer)local_80[0];
          if (local_80[0] == &local_70) goto LAB_005cd8f7;
          goto LAB_005cd8ef;
        }
      }
LAB_005cd8f7:
      pTVar5 = (TestNode *)operator_new(0xe0);
      tcu::StringTemplate::specialize(&local_198,&tmpl,&params);
      if (uVar4 < 3) {
        p_Var9 = (ShaderEvalFunc)(&PTR_evalReturnAlways_00cf7870)[(long)pcVar15];
      }
      else {
        p_Var9 = (ShaderEvalFunc)0x0;
      }
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar5,local_58,&name,&description,bVar23,&local_198,p_Var9,
                 (UniformSetup *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&params);
      tcu::StringTemplate::~StringTemplate(&tmpl);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      bVar22 = bVar23 != false;
      bVar23 = false;
    } while (bVar22);
    uVar4 = uVar4 + 1;
    if (uVar4 == 3) {
      pTVar5 = (TestNode *)operator_new(0xe0);
      pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>((string *)&params,"double_return_vertex","");
      tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tmpl,"Unconditional double return in function","");
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
                 ,"");
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,true,
                 &local_198,evalReturnAlways,(UniformSetup *)0x0);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
        operator_delete(tmpl.m_template._M_dataplus._M_p,
                        tmpl.m_template.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      pTVar5 = (TestNode *)operator_new(0xe0);
      pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>((string *)&params,"double_return_fragment","")
      ;
      tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tmpl,"Unconditional double return in function","");
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
                 ,"");
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,false,
                 &local_198,evalReturnAlways,(UniformSetup *)0x0);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
        operator_delete(tmpl.m_template._M_dataplus._M_p,
                        tmpl.m_template.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      pTVar5 = (TestNode *)operator_new(0xe0);
      pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&params,"last_statement_in_main_vertex","");
      tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tmpl,"Return as a final statement in main()","");
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
                 ,"");
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,true,
                 &local_198,evalReturnAlways,(UniformSetup *)0x0);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
        operator_delete(tmpl.m_template._M_dataplus._M_p,
                        tmpl.m_template.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      pTVar5 = (TestNode *)operator_new(0xe0);
      pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&params,"last_statement_in_main_fragment","");
      tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tmpl,"Return as a final statement in main()","");
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n    o_color = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
                 ,"");
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,false,
                 &local_198,evalReturnAlways,(UniformSetup *)0x0);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT17(local_198.field_2._M_local_buf[7],
                                 CONCAT16(local_198.field_2._M_local_buf[6],
                                          CONCAT15(local_198.field_2._M_local_buf[5],
                                                   CONCAT14(local_198.field_2._M_local_buf[4],
                                                            local_198.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
        operator_delete(tmpl.m_template._M_dataplus._M_p,
                        tmpl.m_template.field_2._M_allocated_capacity + 1);
      }
      pp_Var12 = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ != pp_Var12) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
        pp_Var12 = extraout_RAX;
      }
      uVar10 = CONCAT71((int7)((ulong)pp_Var12 >> 8),1);
      do {
        local_48 = 
        "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\n${EXTRADECL}\nvoid myfunc (void)\n{\n    ${OUTPUT} = vec4(${COORDS}.xyz, 1.0);\n    if (${RETURNCOND})\n        return;\n    ${OUTPUT} = vec4(${COORDS}.wzy, 1.0);\n}\n\nvoid main (void)\n{\n${POSITIONWRITE}    myfunc();\n}\n"
        ;
        if ((char)uVar10 != '\0') {
          local_48 = 
          "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\n${EXTRADECL}\nvoid main ()\n{\n${POSITIONWRITE}    ${OUTPUT} = vec4(${COORDS}.xyz, 1.0);\n    if (${RETURNCOND})\n        return;\n    ${OUTPUT} = vec4(${COORDS}.wzy, 1.0);\n}\n"
          ;
        }
        local_34 = (uint)uVar10;
        bVar23 = (char)uVar10 != '\0';
        local_60 = "in_func_";
        if (bVar23) {
          local_60 = "";
        }
        local_40 = " in user-defined function";
        if (bVar23) {
          local_40 = " in main()";
        }
        __end = local_48 + 0x122;
        if (bVar23) {
          __end = local_48 + 0xf8;
        }
        uVar4 = 0;
        do {
          uVar19 = (ulong)uVar4;
          bVar23 = true;
          do {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"output_write_","")
            ;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
            tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
            psVar14 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar14) {
              tmpl.m_template.field_2._M_allocated_capacity = *psVar14;
              tmpl.m_template.field_2._8_8_ = plVar6[3];
            }
            else {
              tmpl.m_template.field_2._M_allocated_capacity = *psVar14;
              tmpl.m_template._M_dataplus._M_p = (pointer)*plVar6;
            }
            tmpl.m_template._M_string_length = plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&tmpl);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar13 = plVar6 + 2;
            if ((long *)*plVar6 == plVar13) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
              params._M_t._M_impl._0_8_ = (long *)*plVar6;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
            *plVar6 = (long)plVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&params);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar14 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar14) {
              name.field_2._M_allocated_capacity = *psVar14;
              name.field_2._8_8_ = plVar6[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar14;
              name._M_dataplus._M_p = (pointer)*plVar6;
            }
            name._M_string_length = plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
              operator_delete(tmpl.m_template._M_dataplus._M_p,
                              tmpl.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            if (uVar4 < 3) {
              pcVar15 = (&PTR_anon_var_dwarf_c11c2d_00cf7858)[uVar19];
            }
            else {
              pcVar15 = (char *)0x0;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tmpl,pcVar15,(allocator<char> *)&local_198);
            plVar6 = (long *)std::__cxx11::string::append((char *)&tmpl);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar13 = plVar6 + 2;
            if ((long *)*plVar6 == plVar13) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
              params._M_t._M_impl._0_8_ = (long *)*plVar6;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
            *plVar6 = (long)plVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&params);
            description._M_dataplus._M_p = (pointer)&description.field_2;
            psVar14 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar14) {
              description.field_2._M_allocated_capacity = *psVar14;
              description.field_2._8_8_ = plVar6[3];
            }
            else {
              description.field_2._M_allocated_capacity = *psVar14;
              description._M_dataplus._M_p = (pointer)*plVar6;
            }
            description._M_string_length = plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
              operator_delete(tmpl.m_template._M_dataplus._M_p,
                              tmpl.m_template.field_2._M_allocated_capacity + 1);
            }
            local_58 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct<char_const*>((string *)&params,local_48,__end);
            tcu::StringTemplate::StringTemplate(&tmpl,(string *)&params);
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            pcVar15 = "v_coords";
            if (bVar23 != false) {
              pcVar15 = "a_coords";
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
            local_198.field_2._M_local_buf[4] = 'D';
            local_198.field_2._M_local_buf[5] = 'L';
            local_198.field_2._M_local_buf[6] = 'O';
            local_198.field_2._M_local_buf[7] = 'C';
            local_198._M_string_length = 8;
            local_198.field_2._M_local_buf[8] = '\0';
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "%type = OpTypeInt 32 0";
            if (bVar23 != false) {
              pcVar21 = "%type = OpTypeInt 32 1";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)(pcVar21 + 0x15));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
            local_198.field_2._M_local_buf[4] = 'D';
            local_198.field_2._M_local_buf[5] = 'P';
            local_198.field_2._M_local_buf[6] = 'R';
            local_198.field_2._M_local_buf[7] = 'E';
            local_198.field_2._M_local_buf[8] = 'C';
            local_198._M_string_length = 9;
            local_198.field_2._M_local_buf[9] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "_mediump";
            if (bVar23 != false) {
              pcVar21 = "_highp";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)(pcVar21 + 1));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_local_buf[4] = 'D';
            local_198.field_2._M_local_buf[5] = 'S';
            local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
            local_198._M_string_length = 6;
            local_198.field_2._M_local_buf[6] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_local_buf[4] = 'U';
            local_198.field_2._M_local_buf[5] = 'T';
            local_198.field_2._M_allocated_capacity._0_4_ = 0x5054554f;
            local_198._M_string_length = 6;
            local_198.field_2._M_local_buf[6] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "o_color";
            if (bVar23 != false) {
              pcVar21 = "v_color";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x52545845;
            local_198.field_2._M_local_buf[4] = 'A';
            local_198.field_2._M_local_buf[5] = 'D';
            local_198.field_2._M_local_buf[6] = 'E';
            local_198.field_2._M_local_buf[7] = 'C';
            local_198.field_2._M_local_buf[8] = 'L';
            local_198._M_string_length = 9;
            local_198.field_2._M_local_buf[9] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "layout(location = 0) out mediump vec4 o_color;\n";
            if (bVar23 != false) {
              pcVar21 = 
              "layout(location = 0) in highp vec4 a_position;\nlayout(location = 0) out mediump vec4 v_color;\n"
              ;
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_local_buf[8] = 'W';
            local_198.field_2._M_local_buf[9] = 'R';
            local_198.field_2._M_local_buf[10] = 'I';
            local_198.field_2._11_2_ = 0x4554;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x49534f50;
            local_198.field_2._M_local_buf[4] = 'T';
            local_198.field_2._M_local_buf[5] = 'I';
            local_198.field_2._M_local_buf[6] = 'O';
            local_198.field_2._M_local_buf[7] = 'N';
            local_198._M_string_length = 0xd;
            local_198.field_2._M_local_buf[0xd] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "";
            if (bVar23 != false) {
              pcVar21 = "    gl_Position = a_position;\n";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            if (uVar19 == 0) {
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              local_198.field_2._M_allocated_capacity._0_4_ = 0x55544552;
              local_198.field_2._M_local_buf[4] = 'R';
              local_198.field_2._M_local_buf[5] = 'N';
              local_198.field_2._M_local_buf[6] = 'C';
              local_198.field_2._M_local_buf[7] = 'O';
              local_198.field_2._M_local_buf[8] = 'N';
              local_198.field_2._M_local_buf[9] = 'D';
              local_198._M_string_length = 10;
              local_198.field_2._M_local_buf[10] = '\0';
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&params,&local_198);
              std::__cxx11::string::_M_replace
                        ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0xb6d80d);
LAB_005ce5ff:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                uVar10 = CONCAT17(local_198.field_2._M_local_buf[7],
                                  CONCAT16(local_198.field_2._M_local_buf[6],
                                           CONCAT15(local_198.field_2._M_local_buf[5],
                                                    CONCAT14(local_198.field_2._M_local_buf[4],
                                                             local_198.field_2._M_allocated_capacity
                                                             ._0_4_))));
                _Var20._M_p = local_198._M_dataplus._M_p;
LAB_005ce7de:
                operator_delete(_Var20._M_p,uVar10 + 1);
              }
            }
            else {
              if (uVar4 == 1) {
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                local_198.field_2._M_allocated_capacity._0_4_ = 0x55544552;
                local_198.field_2._M_local_buf[4] = 'R';
                local_198.field_2._M_local_buf[5] = 'N';
                local_198.field_2._M_local_buf[6] = 'C';
                local_198.field_2._M_local_buf[7] = 'O';
                local_198.field_2._M_local_buf[8] = 'N';
                local_198.field_2._M_local_buf[9] = 'D';
                local_198._M_string_length = 10;
                local_198.field_2._M_local_buf[10] = '\0';
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_198);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0xb6d600);
                goto LAB_005ce5ff;
              }
              if (uVar4 == 2) {
                local_80[0] = &local_70;
                pcVar21 = "v_coords";
                if (bVar23 != false) {
                  pcVar21 = "a_coords";
                }
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_80,pcVar15,pcVar21 + 8);
                plVar6 = (long *)std::__cxx11::string::append((char *)local_80);
                local_100 = &local_f0;
                plVar13 = plVar6 + 2;
                if ((long *)*plVar6 == plVar13) {
                  local_f0 = *plVar13;
                  lStack_e8 = plVar6[3];
                }
                else {
                  local_f0 = *plVar13;
                  local_100 = (long *)*plVar6;
                }
                local_f8 = plVar6[1];
                *plVar6 = (long)plVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
                local_120 = &local_110;
                plVar13 = plVar6 + 2;
                if ((long *)*plVar6 == plVar13) {
                  local_110 = *plVar13;
                  lStack_108 = plVar6[3];
                }
                else {
                  local_110 = *plVar13;
                  local_120 = (long *)*plVar6;
                }
                local_118 = plVar6[1];
                *plVar6 = (long)plVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                plVar13 = plVar6 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar13) {
                  lVar2 = *plVar13;
                  lVar3 = plVar6[3];
                  local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
                  local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
                  local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
                  local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
                  local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
                  local_198.field_2._M_local_buf[8] = (char)lVar3;
                  local_198.field_2._M_local_buf[9] = (char)((ulong)lVar3 >> 8);
                  local_198.field_2._M_local_buf[10] = (char)((ulong)lVar3 >> 0x10);
                  local_198.field_2._11_2_ = (undefined2)((ulong)lVar3 >> 0x18);
                  local_198.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
                  local_198.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                }
                else {
                  lVar2 = *plVar13;
                  local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
                  local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
                  local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
                  local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
                  local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
                  local_198._M_dataplus._M_p = (pointer)*plVar6;
                }
                local_198._M_string_length = plVar6[1];
                *plVar6 = (long)plVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                local_a0.field_2._M_allocated_capacity = 0x4f434e5255544552;
                local_a0.field_2._8_2_ = 0x444e;
                local_a0._M_string_length = 10;
                local_a0.field_2._M_local_buf[10] = '\0';
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_a0);
                std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_198);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  CONCAT17(local_198.field_2._M_local_buf[7],
                                           CONCAT16(local_198.field_2._M_local_buf[6],
                                                    CONCAT15(local_198.field_2._M_local_buf[5],
                                                             CONCAT14(local_198.field_2._M_local_buf
                                                                      [4],local_198.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_4_)))) + 1);
                }
                if (local_120 != &local_110) {
                  operator_delete(local_120,local_110 + 1);
                }
                if (local_100 != &local_f0) {
                  operator_delete(local_100,local_f0 + 1);
                }
                uVar10 = local_70._M_allocated_capacity;
                _Var20._M_p = (pointer)local_80[0];
                if (local_80[0] == &local_70) goto LAB_005ce7e6;
                goto LAB_005ce7de;
              }
            }
LAB_005ce7e6:
            pTVar5 = (TestNode *)operator_new(0xe0);
            tcu::StringTemplate::specialize(&local_198,&tmpl,&params);
            if (uVar4 < 3) {
              p_Var9 = (ShaderEvalFunc)(&PTR_evalReturnAlways_00cf7870)[uVar19];
            }
            else {
              p_Var9 = (ShaderEvalFunc)0x0;
            }
            ShaderReturnCase::ShaderReturnCase
                      ((ShaderReturnCase *)pTVar5,local_58,&name,&description,bVar23,&local_198,
                       p_Var9,(UniformSetup *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&params);
            tcu::StringTemplate::~StringTemplate(&tmpl);
            tcu::TestNode::addChild((TestNode *)this,pTVar5);
            uVar18 = extraout_RDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)description._M_dataplus._M_p != &description.field_2) {
              operator_delete(description._M_dataplus._M_p,
                              description.field_2._M_allocated_capacity + 1);
              uVar18 = extraout_RDX_00;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              uVar18 = extraout_RDX_01;
            }
            bVar22 = bVar23 != false;
            bVar23 = false;
          } while (bVar22);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
        uVar10 = 0;
      } while ((local_34 & 1) != 0);
      uVar10 = CONCAT71((int7)((ulong)uVar18 >> 8),1);
      do {
        bVar17 = (byte)uVar10;
        local_60 = "dynamic";
        if (bVar17 != 0) {
          local_60 = "static";
        }
        local_40 = "ui_one";
        if (bVar17 != 0) {
          local_40 = "1";
        }
        __end = (char *)CONCAT44(__end._4_4_,(int)uVar10);
        local_48 = (char *)((ulong)((byte)~bVar17 & 1) * 5 + 1);
        uVar4 = 0;
        do {
          uVar19 = (ulong)uVar4;
          bVar23 = true;
          do {
            local_120 = &local_110;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"return_in_","");
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            plVar13 = plVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar13) {
              lVar2 = *plVar13;
              lVar3 = plVar6[3];
              local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
              local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
              local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
              local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
              local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
              local_198.field_2._M_local_buf[8] = (char)lVar3;
              local_198.field_2._M_local_buf[9] = (char)((ulong)lVar3 >> 8);
              local_198.field_2._M_local_buf[10] = (char)((ulong)lVar3 >> 0x10);
              local_198.field_2._11_2_ = (undefined2)((ulong)lVar3 >> 0x18);
              local_198.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
              local_198.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
            }
            else {
              lVar2 = *plVar13;
              local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
              local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
              local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
              local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
              local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
              local_198._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_198._M_string_length = plVar6[1];
            *plVar6 = (long)plVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
            tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
            psVar14 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar14) {
              tmpl.m_template.field_2._M_allocated_capacity = *psVar14;
              tmpl.m_template.field_2._8_8_ = plVar6[3];
            }
            else {
              tmpl.m_template.field_2._M_allocated_capacity = *psVar14;
              tmpl.m_template._M_dataplus._M_p = (pointer)*plVar6;
            }
            tmpl.m_template._M_string_length = plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&tmpl);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar13 = plVar6 + 2;
            if ((long *)*plVar6 == plVar13) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
              params._M_t._M_impl._0_8_ = (long *)*plVar6;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
            *plVar6 = (long)plVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&params);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar14 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar14) {
              name.field_2._M_allocated_capacity = *psVar14;
              name.field_2._8_8_ = plVar6[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar14;
              name._M_dataplus._M_p = (pointer)*plVar6;
            }
            name._M_string_length = plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
              operator_delete(tmpl.m_template._M_dataplus._M_p,
                              tmpl.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            if (uVar4 < 3) {
              pcVar15 = (&PTR_anon_var_dwarf_c11c2d_00cf7858)[uVar19];
            }
            else {
              pcVar15 = (char *)0x0;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,pcVar15,(allocator<char> *)&tmpl);
            plVar6 = (long *)std::__cxx11::string::append((char *)&params);
            description._M_dataplus._M_p = (pointer)&description.field_2;
            psVar14 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar14) {
              description.field_2._M_allocated_capacity = *psVar14;
              description.field_2._8_8_ = plVar6[3];
            }
            else {
              description.field_2._M_allocated_capacity = *psVar14;
              description._M_dataplus._M_p = (pointer)*plVar6;
            }
            description._M_string_length = plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_198._M_dataplus._M_p = (pointer)0x1e4;
            pvVar7 = (void *)std::__cxx11::string::_M_create((ulong *)&params,(ulong)&local_198);
            _Var20._M_p = local_198._M_dataplus._M_p;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)local_198._M_dataplus._M_p;
            params._M_t._M_impl._0_8_ = pvVar7;
            memcpy(pvVar7,
                   "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\nlayout(binding = 0, std140) uniform something { mediump int ui_one; };\n${EXTRADECL}\n${COORDPREC} vec4 getCoords (void)\n{\n    ${COORDPREC} vec4 coords = ${COORDS};\n    for (int i = 0; i < ${ITERLIMIT}; i++)\n    {\n        if (${RETURNCOND})\n            return coords;\n        coords = coords.wzyx;\n    }\n    return coords;\n}\n\nvoid main (void)\n{\n${POSITIONWRITE}    ${OUTPUT} = vec4(getCoords().xyz, 1.0);\n}\n"
                   ,0x1e4);
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = _Var20._M_p;
            *((long)pvVar7 + _Var20._M_p) = '\0';
            tcu::StringTemplate::StringTemplate(&tmpl,(string *)&params);
            local_58 = pTVar1;
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            pcVar15 = "v_coords";
            if (bVar23 != false) {
              pcVar15 = "a_coords";
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
            local_198.field_2._M_local_buf[4] = 'D';
            local_198.field_2._M_local_buf[5] = 'L';
            local_198.field_2._M_local_buf[6] = 'O';
            local_198.field_2._M_local_buf[7] = 'C';
            local_198._M_string_length = 8;
            local_198.field_2._M_local_buf[8] = '\0';
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "%type = OpTypeInt 32 0";
            if (bVar23 != false) {
              pcVar21 = "%type = OpTypeInt 32 1";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)(pcVar21 + 0x15));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
            local_198.field_2._M_local_buf[4] = 'D';
            local_198.field_2._M_local_buf[5] = 'P';
            local_198.field_2._M_local_buf[6] = 'R';
            local_198.field_2._M_local_buf[7] = 'E';
            local_198.field_2._M_local_buf[8] = 'C';
            local_198._M_string_length = 9;
            local_198.field_2._M_local_buf[9] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "_mediump";
            if (bVar23 != false) {
              pcVar21 = "_highp";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)(pcVar21 + 1));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_local_buf[4] = 'U';
            local_198.field_2._M_local_buf[5] = 'T';
            local_198.field_2._M_allocated_capacity._0_4_ = 0x5054554f;
            local_198._M_string_length = 6;
            local_198.field_2._M_local_buf[6] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "o_color";
            if (bVar23 != false) {
              pcVar21 = "v_color";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_local_buf[4] = 'D';
            local_198.field_2._M_local_buf[5] = 'S';
            local_198.field_2._M_allocated_capacity._0_4_ = 0x524f4f43;
            local_198._M_string_length = 6;
            local_198.field_2._M_local_buf[6] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x52545845;
            local_198.field_2._M_local_buf[4] = 'A';
            local_198.field_2._M_local_buf[5] = 'D';
            local_198.field_2._M_local_buf[6] = 'E';
            local_198.field_2._M_local_buf[7] = 'C';
            local_198.field_2._M_local_buf[8] = 'L';
            local_198._M_string_length = 9;
            local_198.field_2._M_local_buf[9] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "layout(location = 0) out mediump vec4 o_color;\n";
            if (bVar23 != false) {
              pcVar21 = 
              "layout(location = 0) in highp vec4 a_position;\nlayout(location = 0) out mediump vec4 v_color;\n"
              ;
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_local_buf[8] = 'W';
            local_198.field_2._M_local_buf[9] = 'R';
            local_198.field_2._M_local_buf[10] = 'I';
            local_198.field_2._11_2_ = 0x4554;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x49534f50;
            local_198.field_2._M_local_buf[4] = 'T';
            local_198.field_2._M_local_buf[5] = 'I';
            local_198.field_2._M_local_buf[6] = 'O';
            local_198.field_2._M_local_buf[7] = 'N';
            local_198._M_string_length = 0xd;
            local_198.field_2._M_local_buf[0xd] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            pcVar21 = "";
            if (bVar23 != false) {
              pcVar21 = "    gl_Position = a_position;\n";
            }
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198.field_2._M_allocated_capacity._0_4_ = 0x52455449;
            local_198.field_2._M_local_buf[4] = 'L';
            local_198.field_2._M_local_buf[5] = 'I';
            local_198.field_2._M_local_buf[6] = 'M';
            local_198.field_2._M_local_buf[7] = 'I';
            local_198.field_2._M_local_buf[8] = 'T';
            local_198._M_string_length = 9;
            local_198.field_2._M_local_buf[9] = '\0';
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_198);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)local_40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            if (uVar19 == 0) {
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              local_198.field_2._M_allocated_capacity._0_4_ = 0x55544552;
              local_198.field_2._M_local_buf[4] = 'R';
              local_198.field_2._M_local_buf[5] = 'N';
              local_198.field_2._M_local_buf[6] = 'C';
              local_198.field_2._M_local_buf[7] = 'O';
              local_198.field_2._M_local_buf[8] = 'N';
              local_198.field_2._M_local_buf[9] = 'D';
              local_198._M_string_length = 10;
              local_198.field_2._M_local_buf[10] = '\0';
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&params,&local_198);
              std::__cxx11::string::_M_replace
                        ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0xb6d80d);
LAB_005cf16c:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                uVar10 = CONCAT17(local_198.field_2._M_local_buf[7],
                                  CONCAT16(local_198.field_2._M_local_buf[6],
                                           CONCAT15(local_198.field_2._M_local_buf[5],
                                                    CONCAT14(local_198.field_2._M_local_buf[4],
                                                             local_198.field_2._M_allocated_capacity
                                                             ._0_4_))));
                _Var20._M_p = local_198._M_dataplus._M_p;
LAB_005cf347:
                operator_delete(_Var20._M_p,uVar10 + 1);
              }
            }
            else {
              if (uVar4 == 1) {
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                local_198.field_2._M_allocated_capacity._0_4_ = 0x55544552;
                local_198.field_2._M_local_buf[4] = 'R';
                local_198.field_2._M_local_buf[5] = 'N';
                local_198.field_2._M_local_buf[6] = 'C';
                local_198.field_2._M_local_buf[7] = 'O';
                local_198.field_2._M_local_buf[8] = 'N';
                local_198.field_2._M_local_buf[9] = 'D';
                local_198._M_string_length = 10;
                local_198.field_2._M_local_buf[10] = '\0';
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_198);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0xb6d600);
                goto LAB_005cf16c;
              }
              if (uVar4 == 2) {
                local_80[0] = &local_70;
                pcVar21 = "v_coords";
                if (bVar23 != false) {
                  pcVar21 = "a_coords";
                }
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_80,pcVar15,pcVar21 + 8);
                plVar6 = (long *)std::__cxx11::string::append((char *)local_80);
                plVar13 = plVar6 + 2;
                if ((long *)*plVar6 == plVar13) {
                  local_f0 = *plVar13;
                  lStack_e8 = plVar6[3];
                  local_100 = &local_f0;
                }
                else {
                  local_f0 = *plVar13;
                  local_100 = (long *)*plVar6;
                }
                local_f8 = plVar6[1];
                *plVar6 = (long)plVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
                local_120 = &local_110;
                plVar13 = plVar6 + 2;
                if ((long *)*plVar6 == plVar13) {
                  local_110 = *plVar13;
                  lStack_108 = plVar6[3];
                }
                else {
                  local_110 = *plVar13;
                  local_120 = (long *)*plVar6;
                }
                local_118 = plVar6[1];
                *plVar6 = (long)plVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                plVar13 = plVar6 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar13) {
                  lVar2 = *plVar13;
                  lVar3 = plVar6[3];
                  local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
                  local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
                  local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
                  local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
                  local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
                  local_198.field_2._M_local_buf[8] = (char)lVar3;
                  local_198.field_2._M_local_buf[9] = (char)((ulong)lVar3 >> 8);
                  local_198.field_2._M_local_buf[10] = (char)((ulong)lVar3 >> 0x10);
                  local_198.field_2._11_2_ = (undefined2)((ulong)lVar3 >> 0x18);
                  local_198.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
                  local_198.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                }
                else {
                  lVar2 = *plVar13;
                  local_198.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar2;
                  local_198.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
                  local_198.field_2._M_local_buf[5] = (char)((ulong)lVar2 >> 0x28);
                  local_198.field_2._M_local_buf[6] = (char)((ulong)lVar2 >> 0x30);
                  local_198.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
                  local_198._M_dataplus._M_p = (pointer)*plVar6;
                }
                local_198._M_string_length = plVar6[1];
                *plVar6 = (long)plVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                local_a0.field_2._M_allocated_capacity = 0x4f434e5255544552;
                local_a0.field_2._8_2_ = 0x444e;
                local_a0._M_string_length = 10;
                local_a0.field_2._M_local_buf[10] = '\0';
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_a0);
                std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_198);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  CONCAT17(local_198.field_2._M_local_buf[7],
                                           CONCAT16(local_198.field_2._M_local_buf[6],
                                                    CONCAT15(local_198.field_2._M_local_buf[5],
                                                             CONCAT14(local_198.field_2._M_local_buf
                                                                      [4],local_198.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_4_)))) + 1);
                }
                if (local_120 != &local_110) {
                  operator_delete(local_120,local_110 + 1);
                }
                if (local_100 != &local_f0) {
                  operator_delete(local_100,local_f0 + 1);
                }
                uVar10 = local_70._M_allocated_capacity;
                _Var20._M_p = (pointer)local_80[0];
                if (local_80[0] == &local_70) goto LAB_005cf34f;
                goto LAB_005cf347;
              }
            }
LAB_005cf34f:
            pTVar5 = (TestNode *)operator_new(0xe0);
            tcu::StringTemplate::specialize(&local_198,&tmpl,&params);
            if (uVar4 < 3) {
              p_Var9 = (ShaderEvalFunc)(&PTR_evalReturnAlways_00cf7870)[uVar19];
            }
            else {
              p_Var9 = (ShaderEvalFunc)0x0;
            }
            pUVar11 = (UniformSetup *)operator_new(0x18);
            UniformSetup::UniformSetup(pUVar11);
            pUVar11->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00cf7810;
            *(undefined4 *)&pUVar11[1]._vptr_UniformSetup = 5;
            ShaderReturnCase::ShaderReturnCase
                      ((ShaderReturnCase *)pTVar5,local_58,&name,&description,bVar23,&local_198,
                       p_Var9,pUVar11);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              CONCAT17(local_198.field_2._M_local_buf[7],
                                       CONCAT16(local_198.field_2._M_local_buf[6],
                                                CONCAT15(local_198.field_2._M_local_buf[5],
                                                         CONCAT14(local_198.field_2._M_local_buf[4],
                                                                  local_198.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&params);
            tcu::StringTemplate::~StringTemplate(&tmpl);
            tcu::TestNode::addChild((TestNode *)this,pTVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)description._M_dataplus._M_p != &description.field_2) {
              operator_delete(description._M_dataplus._M_p,
                              description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            bVar22 = bVar23 != false;
            bVar23 = false;
          } while (bVar22);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
        uVar10 = 0;
        if (((ulong)__end & 1) == 0) {
          pTVar5 = (TestNode *)operator_new(0xe0);
          pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
          params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&params,"return_in_infinite_loop_vertex","");
          tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&tmpl,"Return in infinite loop","");
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,
                     "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\nlayout(binding = 0, std140) uniform something { int ui_zero; };\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
                     ,"");
          pUVar11 = (UniformSetup *)operator_new(0x18);
          UniformSetup::UniformSetup(pUVar11);
          pUVar11->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00cf7810;
          *(undefined4 *)&pUVar11[1]._vptr_UniformSetup = 4;
          ShaderReturnCase::ShaderReturnCase
                    ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,true,
                     &local_198,evalReturnAlways,pUVar11);
          tcu::TestNode::addChild((TestNode *)this,pTVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            CONCAT17(local_198.field_2._M_local_buf[7],
                                     CONCAT16(local_198.field_2._M_local_buf[6],
                                              CONCAT15(local_198.field_2._M_local_buf[5],
                                                       CONCAT14(local_198.field_2._M_local_buf[4],
                                                                local_198.field_2.
                                                                _M_allocated_capacity._0_4_)))) + 1)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
            operator_delete(tmpl.m_template._M_dataplus._M_p,
                            tmpl.m_template.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
              &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)params._M_t._M_impl._0_8_,
                            (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          pTVar5 = (TestNode *)operator_new(0xe0);
          pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
          params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&params,"return_in_infinite_loop_fragment","");
          tmpl.m_template._M_dataplus._M_p = (pointer)&tmpl.m_template.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&tmpl,"Return in infinite loop","");
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,
                     "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nlayout(binding = 0, std140) uniform something { int ui_zero; };\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    o_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
                     ,"");
          pUVar11 = (UniformSetup *)operator_new(0x18);
          UniformSetup::UniformSetup(pUVar11);
          pUVar11->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00cf7810;
          *(undefined4 *)&pUVar11[1]._vptr_UniformSetup = 4;
          ShaderReturnCase::ShaderReturnCase
                    ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,false,
                     &local_198,evalReturnAlways,pUVar11);
          tcu::TestNode::addChild((TestNode *)this,pTVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            CONCAT17(local_198.field_2._M_local_buf[7],
                                     CONCAT16(local_198.field_2._M_local_buf[6],
                                              CONCAT15(local_198.field_2._M_local_buf[5],
                                                       CONCAT14(local_198.field_2._M_local_buf[4],
                                                                local_198.field_2.
                                                                _M_allocated_capacity._0_4_)))) + 1)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)tmpl.m_template._M_dataplus._M_p != &tmpl.m_template.field_2) {
            operator_delete(tmpl.m_template._M_dataplus._M_p,
                            tmpl.m_template.field_2._M_allocated_capacity + 1);
          }
          pp_Var12 = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if ((_Base_ptr *)params._M_t._M_impl._0_8_ != pp_Var12) {
            operator_delete((void *)params._M_t._M_impl._0_8_,
                            (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
            pp_Var12 = extraout_RAX_00;
          }
          return (int)pp_Var12;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ShaderReturnTests::init (void)
{
	addChild(new ShaderReturnCase(m_testCtx, "single_return_vertex", "Single return statement in function", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "single_return_fragment", "Single return statement in function", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			std::string						name		= std::string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			std::string						description	= std::string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			de::MovePtr<ShaderReturnCase>	testCase	(makeConditionalReturnInFuncCase(m_testCtx, name, description, (ReturnMode)returnMode, isFragment == 0));
			addChild(testCase.release());
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_testCtx, "double_return_vertex", "Unconditional double return in function", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "double_return_fragment", "Unconditional double return in function", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_testCtx, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				std::string						name		= std::string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				std::string						desc		= std::string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";
				de::MovePtr<ShaderReturnCase>	testCase	= (makeOutputWriteReturnCase(m_testCtx, name, desc, inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
				addChild(testCase.release());
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				std::string						name		= std::string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				std::string						description	= std::string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				de::MovePtr<ShaderReturnCase>	testCase	(makeReturnInLoopCase(m_testCtx, name, description, isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
				addChild(testCase.release());
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_testCtx, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n"
		"layout(binding = 0, std140) uniform something { int ui_zero; };\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, new ReturnTestUniformSetup(UI_ZERO)));
	addChild(new ShaderReturnCase(m_testCtx, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"layout(binding = 0, std140) uniform something { int ui_zero; };\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, new ReturnTestUniformSetup(UI_ZERO)));
}